

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_json_parser.h
# Opt level: O0

char * flatcc_json_parser_symbol_start(flatcc_json_parser_t *ctx,char *buf,char *end)

{
  char *pcVar1;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  ctx_local = (flatcc_json_parser_t *)buf;
  if (buf != end) {
    if (*buf == '\"') {
      end_local = buf + 1;
      ctx->unquoted = 0;
    }
    else {
      if (*buf == '.') {
        pcVar1 = flatcc_json_parser_set_error(ctx,buf,end,5);
        return pcVar1;
      }
      ctx->unquoted = 1;
      end_local = buf;
    }
    ctx_local = (flatcc_json_parser_t *)end_local;
  }
  return (char *)ctx_local;
}

Assistant:

static inline const char *flatcc_json_parser_symbol_start(flatcc_json_parser_t *ctx, const char *buf, const char *end)
{
    if (buf == end) {
        return buf;
    }
    if (*buf == '\"') {
        ++buf;
#if FLATCC_JSON_PARSE_ALLOW_UNQUOTED
        ctx->unquoted = 0;
#endif
    } else {
#if FLATCC_JSON_PARSE_ALLOW_UNQUOTED
        if (*buf == '.') {
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unexpected_character);
        }
        ctx->unquoted = 1;
#else
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unexpected_character);
#endif
    }
    return buf;
}